

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles3::Functional::FloorCase::compare(FloorCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  float fVar2;
  pointer pSVar3;
  void *pvVar4;
  void *pvVar5;
  uint uVar6;
  int iVar7;
  ostream *poVar8;
  uint uVar9;
  ostringstream *poVar10;
  deUint32 aBits;
  uint uVar11;
  ulong uVar12;
  deUint32 u32;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  Hex<8UL> local_40;
  HexFloat local_34;
  
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar3->varType).m_data.basic.precision;
  uVar6 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  if (PVar1 - PRECISION_MEDIUMP < 2) {
    if ((int)uVar6 < 1) {
      return true;
    }
    pvVar4 = *inputs;
    pvVar5 = *outputs;
    uVar12 = 0;
    do {
      local_34.value = floorf(*(float *)((long)pvVar4 + uVar12 * 4));
      fVar16 = *(float *)((long)pvVar5 + uVar12 * 4);
      uVar11 = (int)local_34.value - (int)fVar16;
      if ((uint)local_34.value < (uint)fVar16) {
        uVar11 = -((int)local_34.value - (int)fVar16);
      }
      if (uVar11 != 0) {
        poVar10 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar10->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
        poVar8 = (ostream *)std::ostream::operator<<(poVar10,(int)uVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] = ",4);
        poVar8 = Functional::operator<<(poVar8,&local_34);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", got ULP diff ",0xf);
LAB_012676df:
        local_40.value = (deUint64)uVar11;
        tcu::Format::Hex<8UL>::toStream(&local_40,poVar8);
        return false;
      }
      uVar12 = uVar12 + 1;
    } while (uVar6 != uVar12);
  }
  else {
    uVar9 = -1 << (0x17 - (&DAT_01c14308)[(ulong)PVar1 * 4] & 0x1f);
    if ((int)uVar6 < 1) {
      return true;
    }
    uVar11 = ~uVar9;
    fVar16 = (float)(uVar9 & 0x7fffff ^ 0x3fffffff) + -1.0;
    pvVar4 = *inputs;
    pvVar5 = *outputs;
    uVar12 = 0;
    do {
      fVar14 = *(float *)((long)pvVar4 + uVar12 * 4);
      fVar2 = *(float *)((long)pvVar5 + uVar12 * 4);
      fVar13 = floorf(fVar14 - fVar16);
      fVar14 = floorf(fVar14 + fVar16);
      iVar7 = (int)fVar13;
      while( true ) {
        if ((int)fVar14 < iVar7) {
          poVar10 = &(this->super_CommonFunctionCase).m_failMsg;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar10->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
          poVar8 = (ostream *)std::ostream::operator<<(poVar10,(int)uVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] = [",5);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)fVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)fVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] with ULP threshold ",0x15);
          goto LAB_012676df;
        }
        fVar15 = (float)iVar7;
        uVar9 = (int)fVar15 - (int)fVar2;
        if ((uint)fVar15 < (uint)fVar2) {
          uVar9 = -((int)fVar15 - (int)fVar2);
        }
        if (uVar9 <= uVar11) break;
        iVar7 = iVar7 + 1;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar6);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref			= deFloatFloor(in0);

				const deUint32	ulpDiff		= getUlpDiff(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(deFloatFloor(in0-eps));
				const int		maxRes		= int(deFloatFloor(in0+eps));
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiff(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}